

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFixtureRunnerTests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e30db::FakeTestFixture::FakeTestFixture
          (FakeTestFixture *this,TestFixtureResults runResults)

{
  FakeTestFixture *this_local;
  TestFixtureResults runResults_local;
  
  ut11::detail::TestFixtureAbstract::TestFixtureAbstract(&this->super_TestFixtureAbstract);
  (this->super_TestFixtureAbstract)._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__FakeTestFixture_00612fc0;
  (this->m_runResults).ran = runResults.ran;
  (this->m_runResults).succeeded = runResults.succeeded;
  this->RunOutputUsed = (Output *)0x0;
  ut11::Mock<void_(ut11::Category)>::Mock(&this->mockAddCategory);
  ut11::
  Mock<std::set<ut11::Category,_std::less<ut11::Category>,_std::allocator<ut11::Category>_>_()>::
  Mock(&this->mockGetCategoriesConst);
  ut11::
  Mock<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>)>
  ::Mock(&this->mockGiven);
  ut11::
  Mock<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>)>
  ::Mock(&this->mockWhen);
  ut11::
  Mock<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>)>
  ::Mock(&this->mockThen);
  ut11::
  Mock<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>)>
  ::Mock(&this->mockFinally);
  ut11::Mock<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  Mock(&this->mockGetNameConst);
  return;
}

Assistant:

FakeTestFixture(ut11::detail::TestFixtureResults runResults)
			: m_runResults(runResults), RunOutputUsed(nullptr)
		{
		}